

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  FunctionPrototypeSyntax *pFVar2;
  Token TVar3;
  Token TVar4;
  BumpAllocator *unaff_retaddr;
  FunctionPortListSyntax **in_stack_00000010;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::ClassSpecifierSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  FunctionPortListSyntax *in_stack_ffffffffffffffa0;
  Info *args_4;
  
  TVar3 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  deepClone<slang::syntax::ClassSpecifierSyntax>(in_stack_00000050,in_stack_00000048);
  TVar4 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = TVar4.info;
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x79eb98);
  deepClone<slang::syntax::DataTypeSyntax>
            ((DataTypeSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x79ebb8);
  deepClone<slang::syntax::NameSyntax>
            ((NameSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x80))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x80))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x80))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x80))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::FunctionPortListSyntax>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  pFVar2 = BumpAllocator::
           emplace<slang::syntax::FunctionPrototypeSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::NameSyntax&,slang::syntax::FunctionPortListSyntax*>
                     (unaff_retaddr,(Token *)__fn,
                      (SyntaxList<slang::syntax::ClassSpecifierSyntax> *)__child_stack,
                      (Token *)TVar3.info,TVar3._0_8_,(NameSyntax *)args_4,in_stack_00000010);
  return (int)pFVar2;
}

Assistant:

static SyntaxNode* clone(const FunctionPrototypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<FunctionPrototypeSyntax>(
        node.keyword.deepClone(alloc),
        *deepClone(node.specifiers, alloc),
        node.lifetime.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.returnType, alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr
    );
}